

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_command_line_params.cpp
# Opt level: O3

bool __thiscall
crnlib::command_line_params::parse
          (command_line_params *this,dynamic_string_array *params,uint n,param_desc *pParam_desc)

{
  uint16 uVar1;
  long lVar2;
  uint uVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  dynamic_string *pdVar9;
  pair<crnlib::dynamic_string,_crnlib::command_line_params::param_value> *ppVar10;
  void *p;
  uint uVar11;
  char *pcVar12;
  uint uVar13;
  param_desc *ppVar14;
  ulong uVar15;
  undefined4 uVar16;
  undefined7 uVar18;
  ulong uVar17;
  dynamic_string_array strings;
  dynamic_string filename;
  dynamic_string key_str;
  dynamic_string val_str [16];
  dynamic_string_array local_1c8;
  pair<crnlib::dynamic_string,_crnlib::command_line_params::param_value> local_1b8;
  uint local_184;
  dynamic_string local_180;
  undefined4 local_16c;
  param_value local_168;
  param_desc *local_150;
  _Rb_tree<crnlib::dynamic_string,std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>,std::_Select1st<std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>>,std::less<crnlib::dynamic_string>,std::allocator<std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>>>
  *local_148;
  ulong local_140;
  pair<crnlib::dynamic_string,_crnlib::command_line_params::param_value> local_138 [6];
  
  local_150 = pParam_desc;
  vector<crnlib::dynamic_string>::operator=(&this->m_params,params);
  if (params->m_size != 0) {
    local_148 = (_Rb_tree<crnlib::dynamic_string,std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>,std::_Select1st<std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>>,std::less<crnlib::dynamic_string>,std::allocator<std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>>>
                 *)&this->m_param_map;
    local_140 = (ulong)n;
    uVar17 = 0;
    local_184 = n;
    do {
      uVar3 = (uint)uVar17;
      uVar11 = uVar3 + 1;
      uVar1 = params->m_p[uVar17].m_len;
      if (uVar1 != 0) {
        pdVar9 = params->m_p + uVar17;
        pcVar12 = pdVar9->m_pStr;
        if (pcVar12 == (char *)0x0) {
          pcVar12 = "";
        }
        if (*pcVar12 == '-') {
          if (uVar1 == 1) {
            console::error("Invalid command line parameter: \"%s\"");
            return false;
          }
          dynamic_string::dynamic_string(&local_180,pdVar9);
          dynamic_string::right(&local_180,1);
          pcVar12 = local_180.m_pStr;
          if (local_180.m_pStr == (char *)0x0) {
            pcVar12 = "";
          }
          uVar18 = (undefined7)((ulong)&local_180 >> 8);
          if (pcVar12[local_180.m_len - 1] == '+') {
            uVar16 = (undefined4)CONCAT71(uVar18,1);
LAB_0010ed28:
            dynamic_string::left(&local_180,local_180.m_len - 1);
          }
          else {
            if (pcVar12[local_180.m_len - 1] == '-') {
              uVar16 = (undefined4)CONCAT71(uVar18,0xff);
              goto LAB_0010ed28;
            }
            uVar16 = 0;
          }
          local_16c = uVar16;
          if (n == 0) {
            uVar17 = 0;
            uVar7 = 0;
LAB_0010ed7a:
            ppVar14 = local_150;
            if ((uint)uVar17 == uVar7) goto LAB_0010ed7f;
            uVar17 = uVar17 & 0xffffffff;
            lVar8 = 0;
            do {
              *(undefined4 *)((long)&local_138[0].first.m_buf_size + lVar8) = 0;
              *(undefined8 *)((long)&local_138[0].first.m_pStr + lVar8) = 0;
              lVar8 = lVar8 + 0x10;
            } while (lVar8 != 0x100);
            uVar13 = local_150[uVar17].m_num_values;
            if (uVar13 == 0) {
              uVar15 = 0;
LAB_0010ee59:
              local_1c8.m_p = (dynamic_string *)0x0;
              local_1c8.m_size = 0;
              local_1c8.m_capacity = 0;
              if ((ppVar14[uVar17].m_support_listing_file == true) && (1 < local_138[0].first.m_len)
                 ) {
                pcVar12 = local_138[0].first.m_pStr;
                if (local_138[0].first.m_pStr == (char *)0x0) {
                  pcVar12 = "";
                }
                if (*pcVar12 != '@') goto LAB_0010ef09;
                dynamic_string::dynamic_string(&local_1b8.first,&local_138[0].first);
                dynamic_string::right(&local_1b8.first,1);
                dynamic_string::unquote(&local_1b8.first);
                pcVar12 = (char *)CONCAT44(local_1b8.first.m_pStr._4_4_,(uint)local_1b8.first.m_pStr
                                          );
                if (pcVar12 == (char *)0x0) {
                  pcVar12 = "";
                }
                bVar5 = load_string_file(pcVar12,&local_1c8);
                pcVar12 = (char *)CONCAT44(local_1b8.first.m_pStr._4_4_,(uint)local_1b8.first.m_pStr
                                          );
                if (bVar5) {
                  if ((pcVar12 != (char *)0x0) &&
                     ((*(uint *)(pcVar12 + -8) ^ *(uint *)(pcVar12 + -4)) == 0xffffffff)) {
                    crnlib_free(pcVar12 + -0x10);
                  }
                  uVar7 = local_1c8.m_size;
                  goto LAB_0010ef77;
                }
                if (pcVar12 == (char *)0x0) {
                  pcVar12 = "";
                }
                console::error("Failed loading listing file \"%s\"!",pcVar12);
                lVar8 = CONCAT44(local_1b8.first.m_pStr._4_4_,(uint)local_1b8.first.m_pStr);
                if ((lVar8 != 0) && ((*(uint *)(lVar8 + -8) ^ *(uint *)(lVar8 + -4)) == 0xffffffff))
                {
                  crnlib_free((void *)(lVar8 + -0x10));
                }
                bVar5 = false;
              }
              else {
LAB_0010ef09:
                if ((int)uVar15 == 0) {
                  uVar7 = 0;
                }
                else {
                  ppVar10 = local_138;
                  do {
                    dynamic_string::unquote(&ppVar10->first);
                    if (local_1c8.m_capacity <= local_1c8.m_size) {
                      elemental_vector::increase_capacity
                                ((elemental_vector *)&local_1c8,local_1c8.m_size + 1,true,0x10,
                                 (object_mover)0x0,false);
                    }
                    dynamic_string::dynamic_string(local_1c8.m_p + local_1c8.m_size,&ppVar10->first)
                    ;
                    uVar7 = local_1c8.m_size + 1;
                    local_1c8.m_size = uVar7;
                    ppVar10 = (pair<crnlib::dynamic_string,_crnlib::command_line_params::param_value>
                               *)&ppVar10->second;
                    uVar15 = uVar15 - 1;
                  } while (uVar15 != 0);
                }
LAB_0010ef77:
                local_168.m_values.m_p = local_1c8.m_p;
                local_168.m_values.m_capacity = local_1c8.m_capacity;
                local_1c8.m_p = (dynamic_string *)0x0;
                local_1c8.m_size = 0;
                local_1c8.m_capacity = 0;
                local_168.m_modifier = (int8)local_16c;
                local_168.m_values.m_size = uVar7;
                local_168.m_index = uVar3;
                std::pair<crnlib::dynamic_string,_crnlib::command_line_params::param_value>::
                pair<crnlib::dynamic_string_&,_crnlib::command_line_params::param_value_&,_true>
                          (&local_1b8,&local_180,&local_168);
                std::
                _Rb_tree<crnlib::dynamic_string,std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>,std::_Select1st<std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>>,std::less<crnlib::dynamic_string>,std::allocator<std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>>>
                ::
                _M_emplace_equal<std::pair<crnlib::dynamic_string,crnlib::command_line_params::param_value>>
                          (local_148,&local_1b8);
                p = (void *)CONCAT44(local_1b8.second.m_values.m_p._4_4_,
                                     (uint)local_1b8.second.m_values.m_p);
                if (p != (void *)0x0) {
                  uVar17 = (ulong)local_1b8.second.m_values.m_size;
                  if (uVar17 != 0) {
                    lVar8 = 0;
                    do {
                      lVar2 = *(long *)((long)p + lVar8 + 8);
                      if ((lVar2 != 0) &&
                         ((*(uint *)(lVar2 + -8) ^ *(uint *)(lVar2 + -4)) == 0xffffffff)) {
                        crnlib_free((void *)(lVar2 + -0x10));
                      }
                      lVar8 = lVar8 + 0x10;
                    } while (uVar17 << 4 != lVar8);
                    p = (void *)CONCAT44(local_1b8.second.m_values.m_p._4_4_,
                                         (uint)local_1b8.second.m_values.m_p);
                  }
                  crnlib_free(p);
                }
                lVar8 = CONCAT44(local_1b8.first.m_pStr._4_4_,(uint)local_1b8.first.m_pStr);
                if ((lVar8 != 0) && ((*(uint *)(lVar8 + -8) ^ *(uint *)(lVar8 + -4)) == 0xffffffff))
                {
                  crnlib_free((void *)(lVar8 + -0x10));
                }
                pdVar9 = local_168.m_values.m_p;
                if (local_168.m_values.m_p != (dynamic_string *)0x0) {
                  uVar17 = (ulong)local_168.m_values.m_size;
                  if (uVar17 != 0) {
                    lVar8 = 0;
                    do {
                      lVar2 = *(long *)((long)&pdVar9->m_pStr + lVar8);
                      if ((lVar2 != 0) &&
                         ((*(uint *)(lVar2 + -8) ^ *(uint *)(lVar2 + -4)) == 0xffffffff)) {
                        crnlib_free((void *)(lVar2 + -0x10));
                      }
                      lVar8 = lVar8 + 0x10;
                    } while (uVar17 << 4 != lVar8);
                  }
                  crnlib_free(local_168.m_values.m_p);
                }
                bVar5 = true;
              }
              pdVar9 = local_1c8.m_p;
              if (local_1c8.m_p != (dynamic_string *)0x0) {
                uVar17 = local_1c8._8_8_ & 0xffffffff;
                if (uVar17 != 0) {
                  lVar8 = 0;
                  do {
                    lVar2 = *(long *)((long)&pdVar9->m_pStr + lVar8);
                    if ((lVar2 != 0) &&
                       ((*(uint *)(lVar2 + -8) ^ *(uint *)(lVar2 + -4)) == 0xffffffff)) {
                      crnlib_free((void *)(lVar2 + -0x10));
                    }
                    lVar8 = lVar8 + 0x10;
                  } while (uVar17 << 4 != lVar8);
                }
                crnlib_free(local_1c8.m_p);
              }
            }
            else {
              if (uVar13 + uVar11 <= params->m_size) {
                uVar15 = 0;
                ppVar10 = local_138;
                do {
                  dynamic_string::set(&ppVar10->first,params->m_p + (uVar11 + (int)uVar15),
                                      0xffffffff);
                  ppVar10 = (pair<crnlib::dynamic_string,_crnlib::command_line_params::param_value>
                             *)&ppVar10->second;
                  uVar13 = (int)uVar15 + 1;
                  uVar15 = (ulong)uVar13;
                } while (uVar13 < ppVar14[uVar17].m_num_values);
                uVar11 = uVar11 + uVar13;
                goto LAB_0010ee59;
              }
              pcVar12 = pdVar9->m_pStr;
              if (pcVar12 == (char *)0x0) {
                pcVar12 = "";
              }
              bVar5 = false;
              console::error("Expected %u value(s) after command line parameter: \"%s\"",
                             (ulong)uVar13,pcVar12);
            }
            lVar8 = 0x100;
            do {
              lVar2 = *(long *)((long)&local_140 + lVar8);
              if ((lVar2 != 0) && ((*(uint *)(lVar2 + -8) ^ *(uint *)(lVar2 + -4)) == 0xffffffff)) {
                crnlib_free((void *)(lVar2 + -0x10));
              }
              lVar8 = lVar8 + -0x10;
            } while (lVar8 != 0);
          }
          else {
            uVar17 = 0;
            ppVar14 = local_150;
            do {
              iVar6 = dynamic_string::compare(&local_180,ppVar14->m_pName,false);
              uVar7 = local_184;
              if (iVar6 == 0) goto LAB_0010ed7a;
              uVar17 = uVar17 + 1;
              ppVar14 = ppVar14 + 1;
            } while (local_140 != uVar17);
LAB_0010ed7f:
            pcVar12 = pdVar9->m_pStr;
            if (pcVar12 == (char *)0x0) {
              pcVar12 = "";
            }
            bVar5 = false;
            console::error("Unrecognized command line parameter: \"%s\"",pcVar12);
          }
          if ((local_180.m_pStr != (char *)0x0) &&
             ((*(uint *)(local_180.m_pStr + -8) ^ *(uint *)(local_180.m_pStr + -4)) == 0xffffffff))
          {
            crnlib_free(local_180.m_pStr + -0x10);
          }
          n = local_184;
          if (!bVar5) {
            return false;
          }
        }
        else {
          local_1b8.first._0_8_ = (dynamic_string *)0x0;
          local_1b8.first.m_pStr._0_4_ = 0;
          local_1b8.first.m_pStr._4_4_ = 0;
          local_1b8.second.m_values.m_p._0_4_ = 0;
          local_1b8.second.m_values.m_p._4_4_ = local_1b8.second.m_values.m_p._4_4_ & 0xffffff00;
          elemental_vector::increase_capacity
                    ((elemental_vector *)&local_1b8,1,true,0x10,(object_mover)0x0,false);
          dynamic_string::dynamic_string
                    ((dynamic_string *)
                     (local_1b8.first._0_8_ + (ulong)(uint)local_1b8.first.m_pStr * 0x10),pdVar9);
          uVar17 = (ulong)(uint)local_1b8.first.m_pStr;
          local_1b8.first.m_pStr._0_4_ = (uint)local_1b8.first.m_pStr + 1;
          dynamic_string::unquote((dynamic_string *)(local_1b8.first._0_8_ + uVar17 * 0x10));
          local_1b8.second.m_values.m_p._0_4_ = uVar3;
          std::pair<crnlib::dynamic_string,_crnlib::command_line_params::param_value>::
          pair<crnlib::dynamic_string_&,_crnlib::command_line_params::param_value_&,_true>
                    (local_138,(dynamic_string *)g_empty_dynamic_string,(param_value *)&local_1b8);
          std::
          _Rb_tree<crnlib::dynamic_string,std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>,std::_Select1st<std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>>,std::less<crnlib::dynamic_string>,std::allocator<std::pair<crnlib::dynamic_string_const,crnlib::command_line_params::param_value>>>
          ::
          _M_emplace_equal<std::pair<crnlib::dynamic_string,crnlib::command_line_params::param_value>>
                    (local_148,local_138);
          pdVar9 = local_138[0].second.m_values.m_p;
          if (local_138[0].second.m_values.m_p != (dynamic_string *)0x0) {
            uVar17 = (ulong)local_138[0].second.m_values.m_size;
            if (uVar17 != 0) {
              lVar8 = 0;
              do {
                lVar2 = *(long *)((long)&pdVar9->m_pStr + lVar8);
                if ((lVar2 != 0) && ((*(uint *)(lVar2 + -8) ^ *(uint *)(lVar2 + -4)) == 0xffffffff))
                {
                  crnlib_free((void *)(lVar2 + -0x10));
                }
                lVar8 = lVar8 + 0x10;
              } while (uVar17 << 4 != lVar8);
            }
            crnlib_free(local_138[0].second.m_values.m_p);
          }
          if ((local_138[0].first.m_pStr != (char *)0x0) &&
             ((*(uint *)(local_138[0].first.m_pStr + -8) ^ *(uint *)(local_138[0].first.m_pStr + -4)
              ) == 0xffffffff)) {
            crnlib_free(local_138[0].first.m_pStr + -0x10);
          }
          uVar4 = local_1b8.first._0_8_;
          if ((dynamic_string *)local_1b8.first._0_8_ != (dynamic_string *)0x0) {
            uVar17 = (ulong)(uint)local_1b8.first.m_pStr;
            if (uVar17 != 0) {
              lVar8 = 0;
              do {
                lVar2 = *(long *)(uVar4 + 8 + lVar8);
                if ((lVar2 != 0) && ((*(uint *)(lVar2 + -8) ^ *(uint *)(lVar2 + -4)) == 0xffffffff))
                {
                  crnlib_free((void *)(lVar2 + -0x10));
                }
                lVar8 = lVar8 + 0x10;
              } while (uVar17 << 4 != lVar8);
            }
            crnlib_free((void *)local_1b8.first._0_8_);
          }
        }
      }
      uVar17 = (ulong)uVar11;
    } while (uVar11 < params->m_size);
  }
  return true;
}

Assistant:

bool command_line_params::parse(const dynamic_string_array& params, uint n, const param_desc* pParam_desc)
    {
        CRNLIB_ASSERT(n && pParam_desc);

        m_params = params;

        uint arg_index = 0;
        while (arg_index < params.size())
        {
            const uint cur_arg_index = arg_index;
            const dynamic_string& src_param = params[arg_index++];

            if (src_param.is_empty())
            {
                continue;
            }
#if CRNLIB_CMD_LINE_ALLOW_SLASH_PARAMS
            if ((src_param[0] == '/') || (src_param[0] == '-'))
#else
            if (src_param[0] == '-')
#endif
            {
                if (src_param.get_len() < 2)
                {
                    console::error("Invalid command line parameter: \"%s\"", src_param.get_ptr());
                    return false;
                }

                dynamic_string key_str(src_param);

                key_str.right(1);

                int modifier = 0;
                char c = key_str[key_str.get_len() - 1];
                if (c == '+')
                {
                    modifier = 1;
                }
                else if (c == '-')
                {
                    modifier = -1;
                }
                if (modifier)
                {
                    key_str.left(key_str.get_len() - 1);
                }
                uint param_index;
                for (param_index = 0; param_index < n; param_index++)
                {
                    if (key_str == pParam_desc[param_index].m_pName)
                    {
                        break;
                    }
                }

                if (param_index == n)
                {
                    console::error("Unrecognized command line parameter: \"%s\"", src_param.get_ptr());
                    return false;
                }

                const param_desc& desc = pParam_desc[param_index];

                const uint cMaxValues = 16;
                dynamic_string val_str[cMaxValues];
                uint num_val_strs = 0;
                if (desc.m_num_values)
                {
                    CRNLIB_ASSERT(desc.m_num_values <= cMaxValues);

                    if ((arg_index + desc.m_num_values) > params.size())
                    {
                        console::error("Expected %u value(s) after command line parameter: \"%s\"", desc.m_num_values, src_param.get_ptr());
                        return false;
                    }

                    for (uint v = 0; v < desc.m_num_values; v++)
                    {
                        val_str[num_val_strs++] = params[arg_index++];
                    }
                }

                dynamic_string_array strings;

                if ((desc.m_support_listing_file) && (val_str[0].get_len() >= 2) && (val_str[0][0] == '@'))
                {
                    dynamic_string filename(val_str[0]);
                    filename.right(1);
                    filename.unquote();

                    if (!load_string_file(filename.get_ptr(), strings))
                    {
                        console::error("Failed loading listing file \"%s\"!", filename.get_ptr());
                        return false;
                    }
                }
                else
                {
                    for (uint v = 0; v < num_val_strs; v++)
                    {
                        val_str[v].unquote();
                        strings.push_back(val_str[v]);
                    }
                }

                param_value pv;
                pv.m_values.swap(strings);
                pv.m_index = cur_arg_index;
                pv.m_modifier = (int8)modifier;
                m_param_map.insert(std::make_pair(key_str, pv));
            }
            else
            {
                param_value pv;
                pv.m_values.push_back(src_param);
                pv.m_values.back().unquote();
                pv.m_index = cur_arg_index;
                m_param_map.insert(std::make_pair(g_empty_dynamic_string, pv));
            }
        }

        return true;
    }